

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

int execvp(char *__file,char **__argv)

{
  int iVar1;
  char *filename;
  apprun_exec_args_t *args;
  
  filename = apprun_resolve_file_from_path_env_if_required(__file);
  args = apprun_adjusted_exec_args(filename,__argv,_environ);
  real_execvpe = (execvpe_func_t)dlsym(0xffffffffffffffff,"execvpe");
  iVar1 = (*real_execvpe)(args->file,args->args,args->envp);
  apprun_restore_workdir_if_needed();
  apprun_exec_args_free(args);
  free(filename);
  return iVar1;
}

Assistant:

int execvp(const char *filename, char *const argv[]) {
    char * resolved_filename = apprun_resolve_file_from_path_env_if_required(filename);
    apprun_exec_args_t *new_exec_args = apprun_adjusted_exec_args(resolved_filename, argv, environ);

    real_execvpe = dlsym(RTLD_NEXT, "execvpe");
    int ret = real_execvpe(new_exec_args->file, new_exec_args->args, new_exec_args->envp);

    apprun_restore_workdir_if_needed();
    apprun_exec_args_free(new_exec_args);
    free(resolved_filename);
    return ret;
}